

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vlog_is_on.cc
# Opt level: O3

bool google::InitVLOG3__(SiteFlag *site_flag,int32 *level_default,char *fname,int32 verbose_level)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  string *psVar5;
  string *psVar6;
  char *pcVar7;
  string *psVar8;
  size_t str_len;
  string *psVar9;
  string pattern;
  undefined4 local_6c;
  char *local_68;
  string *local_60;
  SiteFlag *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)vmodule_mutex);
  cVar1 = inited_vmodule;
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  if (inited_vmodule == '\0') {
    inited_vmodule = 0;
    psVar6 = (string *)0x0;
    psVar9 = (string *)0x0;
    pcVar7 = fLS::FLAGS_vmodule_buf_abi_cxx11_;
    local_68 = fname;
    local_60 = (string *)level_default;
    local_58 = site_flag;
    do {
      pcVar4 = strchr(pcVar7,0x3d);
      psVar5 = psVar6;
      psVar8 = psVar9;
      if (pcVar4 == (char *)0x0) break;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,pcVar7,pcVar4);
      iVar3 = __isoc99_sscanf(pcVar4,"=%d",&local_6c);
      if (iVar3 == 1) {
        psVar5 = (string *)operator_new(0x30);
        *(string **)psVar5 = psVar5 + 0x10;
        *(undefined8 *)(psVar5 + 8) = 0;
        psVar5[0x10] = (string)0x0;
        std::__cxx11::string::_M_assign(psVar5);
        *(undefined4 *)(psVar5 + 0x20) = local_6c;
        psVar8 = psVar5;
        if (psVar9 != (string *)0x0) {
          *(string **)(psVar6 + 0x28) = psVar5;
          psVar8 = psVar9;
        }
      }
      pcVar4 = strchr(pcVar4,0x2c);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      pcVar7 = pcVar4 + 1;
      psVar6 = psVar5;
      psVar9 = psVar8;
    } while (pcVar4 != (char *)0x0);
    if (psVar8 != (string *)0x0) {
      *(string **)(psVar5 + 0x28) = vmodule_list;
      vmodule_list = psVar8;
    }
    inited_vmodule = '\x01';
    level_default = (int32 *)local_60;
    fname = local_68;
    site_flag = local_58;
  }
  pcVar4 = strrchr(fname,0x2f);
  pcVar7 = pcVar4 + 1;
  if (pcVar4 == (char *)0x0) {
    pcVar7 = fname;
  }
  pcVar4 = strchr(pcVar7,0x2e);
  if (pcVar4 == (char *)0x0) {
    str_len = strlen(pcVar7);
  }
  else {
    str_len = (long)pcVar4 - (long)pcVar7;
  }
  psVar6 = vmodule_list;
  if ((3 < str_len) && (*(int *)(pcVar7 + (str_len - 4)) == 0x6c6e692d)) {
    str_len = str_len - 4;
  }
  do {
    psVar9 = (string *)level_default;
    if (psVar6 == (string *)0x0) {
LAB_001219d5:
      if (((cVar1 != '\0') &&
          (site_flag->level = (int32 *)psVar9, psVar9 == (string *)level_default)) &&
         (site_flag->base_name == (char *)0x0)) {
        site_flag->base_name = pcVar7;
        site_flag->base_len = str_len;
        site_flag->next = cached_site_list;
        cached_site_list = site_flag;
      }
      iVar3 = *(int *)psVar9;
      pthread_mutex_unlock((pthread_mutex_t *)vmodule_mutex);
      return verbose_level <= iVar3;
    }
    bVar2 = glog_internal_namespace_::SafeFNMatch_
                      (*(char **)psVar6,*(size_t *)(psVar6 + 8),pcVar7,str_len);
    if (bVar2) {
      psVar9 = psVar6 + 0x20;
      goto LAB_001219d5;
    }
    psVar6 = *(string **)(psVar6 + 0x28);
  } while( true );
}

Assistant:

bool InitVLOG3__(SiteFlag* site_flag, int32* level_default, const char* fname,
                 int32 verbose_level) {
  std::lock_guard<std::mutex> l(vmodule_mutex);
  bool read_vmodule_flag = inited_vmodule;
  if (!read_vmodule_flag) {
    VLOG2Initializer();
  }

  // protect the errno global in case someone writes:
  // VLOG(..) << "The last error was " << strerror(errno)
  int old_errno = errno;

  // site_default normally points to FLAGS_v
  int32* site_flag_value = level_default;

  // Get basename for file
  const char* base = strrchr(fname, '/');

#ifdef _WIN32
  if (!base) {
    base = strrchr(fname, '\\');
  }
#endif

  base = base ? (base + 1) : fname;
  const char* base_end = strchr(base, '.');
  size_t base_length =
      base_end ? static_cast<size_t>(base_end - base) : strlen(base);

  // Trim out trailing "-inl" if any
  if (base_length >= 4 && (memcmp(base + base_length - 4, "-inl", 4) == 0)) {
    base_length -= 4;
  }

  // TODO: Trim out _unittest suffix?  Perhaps it is better to have
  // the extra control and just leave it there.

  // find target in vector of modules, replace site_flag_value with
  // a module-specific verbose level, if any.
  for (const VModuleInfo* info = vmodule_list; info != nullptr;
       info = info->next) {
    if (SafeFNMatch_(info->module_pattern.c_str(), info->module_pattern.size(),
                     base, base_length)) {
      site_flag_value = &info->vlog_level;
      // value at info->vlog_level is now what controls
      // the VLOG at the caller site forever
      break;
    }
  }

  // Cache the vlog value pointer if --vmodule flag has been parsed.
  ANNOTATE_BENIGN_RACE(site_flag,
                       "*site_flag may be written by several threads,"
                       " but the value will be the same");
  if (read_vmodule_flag) {
    site_flag->level = site_flag_value;
    // If VLOG flag has been cached to the default site pointer,
    // we want to add to the cached list in order to invalidate in case
    // SetVModule is called afterwards with new modules.
    // The performance penalty here is neglible, because InitVLOG3__ is called
    // once per site.
    if (site_flag_value == level_default && !site_flag->base_name) {
      site_flag->base_name = base;
      site_flag->base_len = base_length;
      site_flag->next = cached_site_list;
      cached_site_list = site_flag;
    }
  }

  // restore the errno in case something recoverable went wrong during
  // the initialization of the VLOG mechanism (see above note "protect the..")
  errno = old_errno;
  return *site_flag_value >= verbose_level;
}